

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::updateSpan(QSpanCollection *this,Span *span,int old_height)

{
  Index *this_00;
  _Rb_tree_color _Var1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  int local_44;
  Span *span_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = span->m_top;
  iVar6 = span->m_bottom;
  iVar5 = (iVar6 - iVar2) + 1;
  span_local = span;
  if (old_height < iVar5) {
    local_44 = 1 - (iVar2 + old_height);
    iVar3._M_node =
         (_Base_ptr)
         QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(&this->index,&local_44);
    while (SBORROW4(span_local->m_bottom,-iVar3._M_node[1]._M_color) ==
           (int)(span_local->m_bottom + iVar3._M_node[1]._M_color) < 0) {
      local_44 = -span_local->m_left;
      QMap<int,_QSpanCollection::Span_*>::insert
                ((QMap<int,_QSpanCollection::Span_*> *)&iVar3._M_node[1]._M_parent,&local_44,
                 &span_local);
      iVar4 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(&this->index);
      if ((iterator)iVar3._M_node == iVar4.i._M_node) break;
      iVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar3._M_node);
    }
  }
  else if (iVar5 < old_height) {
    if (iVar2 < iVar6) {
      iVar2 = iVar6;
    }
    this_00 = &this->index;
    local_44 = -iVar2;
    iVar3._M_node =
         (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(this_00,&local_44);
    while( true ) {
      _Var1 = iVar3._M_node[1]._M_color;
      iVar2 = -_Var1;
      iVar6 = span_local->m_top + old_height;
      if (iVar6 == iVar2 || SBORROW4(iVar6,iVar2) != (int)(iVar6 + _Var1) < 0) break;
      if (SBORROW4(span_local->m_bottom,iVar2) != (int)(span_local->m_bottom + _Var1) < 0) {
        local_44 = -span_local->m_left;
        QMap<int,_QSpanCollection::Span_*>::remove
                  ((QMap<int,_QSpanCollection::Span_*> *)&iVar3._M_node[1]._M_parent,
                   (char *)&local_44);
        if ((iVar3._M_node[1]._M_parent == (_Base_ptr)0x0) ||
           (iVar3._M_node[1]._M_parent[1]._M_left == (_Base_ptr)0x0)) {
          iVar3._M_node =
               (_Base_ptr)
               QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(this_00,iVar3._M_node);
        }
      }
      iVar4 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(this_00);
      if ((iterator)iVar3._M_node == iVar4.i._M_node) break;
      iVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar3._M_node);
    }
  }
  if ((span_local->m_right + 1 == span_local->m_left) &&
     (span_local->m_bottom + 1 == span_local->m_top)) {
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::remove
              (&this->spans,(char *)&span_local);
    operator_delete(span_local,0x14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateSpan(QSpanCollection::Span *span, int old_height)
{
    if (old_height < span->height()) {
        //add the span as subspan in all the lists that intersect the new covered columns
        Index::iterator it_y = index.lowerBound(-(span->top() + old_height - 1));
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->bottom()) {
            (*it_y).insert(-span->left(), span);
            if (it_y == index.begin())
                break;
            --it_y;
        }
    } else if (old_height > span->height()) {
        //remove the span from all the subspans lists that intersect the columns not covered anymore
        Index::iterator it_y = index.lowerBound(-qMax(span->bottom(), span->top())); //qMax useful if height is 0
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->top() + old_height -1) {
            if (-it_y.key() > span->bottom()) {
                int removed = (*it_y).remove(-span->left());
                Q_ASSERT(removed == 1);
                Q_UNUSED(removed);
                if (it_y->isEmpty()) {
                    it_y = index.erase(it_y);
                }
            }
            if (it_y == index.begin())
                break;
            --it_y;
        }
    }

    if (span->width() == 0 && span->height() == 0) {
        spans.remove(span);
        delete span;
    }
}